

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

int cppcms_capi_session_pool_init_from_json(cppcms_capi_session_pool *pool,char *json)

{
  bool bVar1;
  session_pool *this;
  ostream *this_00;
  runtime_error *this_01;
  int iVar2;
  value v;
  int line;
  allocator local_340 [32];
  ostringstream ss;
  istringstream f;
  
  iVar2 = -1;
  if (pool != (cppcms_capi_session_pool *)0x0) {
    anon_unknown.dwarf_329815::check_str(json);
    cppcms::json::value::copyable::copyable(&v.d);
    std::__cxx11::string::string((string *)&ss,json,local_340);
    std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&ss,_S_in);
    std::__cxx11::string::~string((string *)&ss);
    line = 0;
    bVar1 = cppcms::json::value::load(&v,(istream *)&f,true,&line);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      this_00 = std::operator<<((ostream *)&ss,"Failed to parse json syntax error in line ");
      std::ostream::operator<<(this_00,line);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,(string *)local_340);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this = (session_pool *)operator_new(0x28);
    cppcms::session_pool::session_pool(this,&v);
    booster::hold_ptr<cppcms::session_pool>::reset(&pool->p,this);
    cppcms::session_pool::init((pool->p).ptr_,(EVP_PKEY_CTX *)this);
    std::__cxx11::istringstream::~istringstream((istringstream *)&f);
    cppcms::json::value::copyable::~copyable(&v.d);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cppcms_capi_session_pool_init_from_json(cppcms_capi_session_pool *pool,char const *json)
{
	try {
		if(!pool)
			return -1;
		check_str(json);
		cppcms::json::value v;
		std::istringstream f(json);
		int line = 0;
		if(!v.load(f,true,&line)) {
			std::ostringstream ss;
			ss << "Failed to parse json syntax error in line " << line;
			throw std::runtime_error(ss.str());
		}
		pool->p.reset(new cppcms::session_pool(v));
		pool->p->init();
	} CATCH(pool,0,-1);
}